

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O1

void memory_listener_register_ppc(MemoryListener *listener,AddressSpace *as)

{
  uc_struct_conflict12 *puVar1;
  FlatView *pFVar2;
  FlatRange *pFVar3;
  MemoryRegionSection local_68;
  
  listener->address_space = as;
  (listener->link).tqe_next = (MemoryListener *)0x0;
  (listener->link).tqe_circ.tql_prev = (as->uc->memory_listeners).tqh_circ.tql_prev;
  puVar1 = as->uc;
  ((puVar1->memory_listeners).tqh_circ.tql_prev)->tql_next = listener;
  (puVar1->memory_listeners).tqh_circ.tql_prev = (QTailQLink *)&listener->link;
  (listener->link_as).tqe_next = (MemoryListener *)0x0;
  (listener->link_as).tqe_circ.tql_prev = (as->listeners).tqh_circ.tql_prev;
  ((as->listeners).tqh_circ.tql_prev)->tql_next = listener;
  (as->listeners).tqh_circ.tql_prev = (QTailQLink *)&listener->link_as;
  if (listener->begin != (_func_void_MemoryListener_ptr *)0x0) {
    (*listener->begin)(listener);
  }
  pFVar2 = as->current_map;
  if (pFVar2->nr != 0) {
    pFVar3 = pFVar2->ranges;
    do {
      local_68.size._0_4_ = (undefined4)(pFVar3->addr).size;
      local_68.size._4_4_ = *(undefined4 *)((long)&(pFVar3->addr).size + 4);
      local_68.size._8_4_ = *(undefined4 *)((long)&(pFVar3->addr).size + 8);
      local_68.size._12_4_ = *(undefined4 *)((long)&(pFVar3->addr).size + 0xc);
      local_68.mr = pFVar3->mr;
      local_68.offset_within_region = pFVar3->offset_in_region;
      local_68.fv = pFVar2;
      if (*(long *)((long)&(pFVar3->addr).start + 8) != 0) {
        __assert_fail("r == a",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/qemu/int128.h"
                      ,0x16,"uint64_t int128_get64(Int128)");
      }
      local_68.offset_within_address_space = (hwaddr)(pFVar3->addr).start;
      local_68.readonly = pFVar3->readonly;
      if (listener->region_add != (_func_void_MemoryListener_ptr_MemoryRegionSection_ptr *)0x0) {
        (*listener->region_add)(listener,&local_68);
      }
      pFVar3 = pFVar3 + 1;
    } while (pFVar3 < pFVar2->ranges + pFVar2->nr);
  }
  if (listener->commit != (_func_void_MemoryListener_ptr *)0x0) {
    (*listener->commit)(listener);
  }
  return;
}

Assistant:

void memory_listener_register(MemoryListener *listener, AddressSpace *as)
{
    listener->address_space = as;
    QTAILQ_INSERT_TAIL(&as->uc->memory_listeners, listener, link);
    QTAILQ_INSERT_TAIL(&as->listeners, listener, link_as);

    listener_add_address_space(listener, as);
}